

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O0

void ExtractFastKeypoints
               (Mat *anImage,vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *fastPoints)

{
  int iVar1;
  FastFeatureDetector *pFVar2;
  undefined8 uVar3;
  ostream *poVar4;
  size_type sVar5;
  int in_R8D;
  _InputArray local_158;
  _InputArray local_140;
  _InputArray local_128;
  Mat local_110 [8];
  Mat srcImage;
  _OutputArray local_a0;
  Mat local_88 [8];
  Mat anImage8;
  Ptr<cv::FastFeatureDetector> local_28 [8];
  Ptr<cv::FastFeatureDetector> FAST;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *fastPoints_local;
  Mat *anImage_local;
  
  std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::clear(fastPoints);
  cv::FastFeatureDetector::create(local_28,10,1);
  cv::Mat::Mat(local_88);
  iVar1 = cv::Mat::type(anImage);
  if (iVar1 == 5) {
    cv::_OutputArray::_OutputArray(&local_a0,local_88);
    cv::Mat::convertTo((_OutputArray *)anImage,(int)&local_a0,255.0,0.0);
    cv::_OutputArray::~_OutputArray(&local_a0);
  }
  else {
    cv::Mat::operator=(local_88,anImage);
  }
  cv::Mat::Mat(local_110);
  iVar1 = cv::Mat::channels(local_88);
  if (iVar1 == 1) {
    cv::_InputArray::_InputArray(&local_128,local_88);
    cv::_OutputArray::_OutputArray((_OutputArray *)&local_140,local_110);
    cv::cvtColor((cv *)&local_128,&local_140,(_OutputArray *)0x8,0,in_R8D);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&local_140);
    cv::_InputArray::~_InputArray(&local_128);
  }
  else {
    cv::Mat::operator=(local_110,local_88);
  }
  pFVar2 = cv::Ptr<cv::FastFeatureDetector>::operator->(local_28);
  cv::_InputArray::_InputArray(&local_158,local_110);
  uVar3 = cv::noArray();
  (**(code **)(*(long *)pFVar2 + 0x40))(pFVar2,&local_158,fastPoints,uVar3);
  cv::_InputArray::~_InputArray(&local_158);
  poVar4 = std::operator<<((ostream *)&std::cerr,"Detected ");
  sVar5 = std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::size(fastPoints);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
  std::operator<<(poVar4," FAST\n");
  cv::Mat::~Mat(local_110);
  cv::Mat::~Mat(local_88);
  cv::Ptr<cv::FastFeatureDetector>::~Ptr(local_28);
  return;
}

Assistant:

static
void ExtractFastKeypoints(cv::Mat const &anImage, std::vector<cv::KeyPoint> &fastPoints)
{
  fastPoints.clear();
  auto FAST = cv::FastFeatureDetector::create();

  cv::Mat anImage8;
  if (anImage.type() == CV_32F)
    anImage.convertTo(anImage8, CV_8U, 255.0);
  else
    anImage8 = anImage;

  cv::Mat srcImage;
  if (anImage8.channels() == 1)
    cv::cvtColor(anImage8, srcImage, cv::COLOR_GRAY2BGR);
  else
    srcImage = anImage8;

  FAST->detect(srcImage, fastPoints);
  std::cerr << "Detected " << fastPoints.size() << " FAST\n";
}